

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void PTCHelper(IClosestPointMapper *mapper,ON_Mesh *meshTo,ON_3fVector *vtFaceNormal,ON_3dPoint *vtx
              ,int i0,int i1,int i2,ON_3dPoint *tOut)

{
  ON_3dPoint local_330;
  ON_3dPoint local_318;
  ON_3dPoint local_300;
  ON_3dVector local_2e8;
  ON_3dPoint local_2d0;
  ON_3dPoint local_2b8;
  ON_3dPoint local_2a0;
  ON_3dVector local_288;
  ON_3dPoint local_270;
  ON_3dPoint local_258;
  ON_3dPoint local_240;
  ON_3dVector local_228;
  int local_20c;
  undefined1 auStack_208 [4];
  int i;
  ON_3dPoint sample_tcs [3];
  ON_3dPoint local_1b8;
  ON_3dPoint local_1a0;
  ON_3dPoint local_188;
  ON_3dPoint local_170;
  ON_3dPoint local_158;
  ON_3dPoint local_140;
  ON_3dPoint local_128;
  ON_3dPoint local_110;
  ON_3dPoint local_f8;
  ON_3dPoint local_e0;
  ON_3dPoint local_c8;
  ON_3dPoint local_b0;
  double local_98;
  ON_3dPoint sample_points [3];
  double k;
  double m;
  double n;
  int i1_local;
  int i0_local;
  ON_3dPoint *vtx_local;
  ON_3fVector *vtFaceNormal_local;
  ON_Mesh *meshTo_local;
  IClosestPointMapper *mapper_local;
  
  operator*(&local_c8,0.6,vtx + i0);
  ON_3dPoint::operator+(&local_f8,vtx + i1,vtx + i2);
  operator*(&local_e0,0.2,&local_f8);
  ON_3dPoint::operator+(&local_b0,&local_c8,&local_e0);
  local_98 = local_b0.x;
  sample_points[0].x = local_b0.y;
  sample_points[0].y = local_b0.z;
  operator*(&local_128,0.6,vtx + i1);
  ON_3dPoint::operator+(&local_158,vtx + i0,vtx + i2);
  operator*(&local_140,0.2,&local_158);
  ON_3dPoint::operator+(&local_110,&local_128,&local_140);
  sample_points[0].z = local_110.x;
  sample_points[1].x = local_110.y;
  sample_points[1].y = local_110.z;
  operator*(&local_188,0.6,vtx + i2);
  ON_3dPoint::operator+(&local_1b8,vtx + i0,vtx + i1);
  operator*(&local_1a0,0.2,&local_1b8);
  ON_3dPoint::operator+(&local_170,&local_188,&local_1a0);
  sample_points[1].z = local_170.x;
  sample_points[2].x = local_170.y;
  sample_points[2].y = local_170.z;
  _auStack_208 = ON_3dPoint::Origin.x;
  sample_tcs[0].x = ON_3dPoint::Origin.y;
  sample_tcs[0].y = ON_3dPoint::Origin.z;
  sample_tcs[0].z = ON_3dPoint::Origin.x;
  sample_tcs[1].x = ON_3dPoint::Origin.y;
  sample_tcs[1].y = ON_3dPoint::Origin.z;
  sample_tcs[1].z = ON_3dPoint::Origin.x;
  sample_tcs[2].x = ON_3dPoint::Origin.y;
  sample_tcs[2].y = ON_3dPoint::Origin.z;
  for (local_20c = 0; local_20c < 3; local_20c = local_20c + 1) {
    (*mapper->_vptr_IClosestPointMapper[3])
              (mapper,&sample_points[(long)local_20c + -1].z,vtFaceNormal,
               &sample_tcs[(long)local_20c + -1].z);
  }
  operator*(&local_240,2.0,(ON_3dPoint *)auStack_208);
  ON_3dPoint::operator+(&local_270,(ON_3dPoint *)&sample_tcs[0].z,(ON_3dPoint *)&sample_tcs[1].z);
  operator*(&local_258,0.5,&local_270);
  ON_3dPoint::operator-(&local_228,&local_240,&local_258);
  ON_3dPoint::operator=(tOut,&local_228);
  operator*(&local_2a0,2.0,(ON_3dPoint *)&sample_tcs[0].z);
  ON_3dPoint::operator+(&local_2d0,(ON_3dPoint *)auStack_208,(ON_3dPoint *)&sample_tcs[1].z);
  operator*(&local_2b8,0.5,&local_2d0);
  ON_3dPoint::operator-(&local_288,&local_2a0,&local_2b8);
  ON_3dPoint::operator=(tOut + 1,&local_288);
  operator*(&local_300,2.0,(ON_3dPoint *)&sample_tcs[1].z);
  ON_3dPoint::operator+(&local_330,(ON_3dPoint *)auStack_208,(ON_3dPoint *)&sample_tcs[0].z);
  operator*(&local_318,0.5,&local_330);
  ON_3dPoint::operator-(&local_2e8,&local_300,&local_318);
  ON_3dPoint::operator=(tOut + 2,&local_2e8);
  return;
}

Assistant:

static void PTCHelper(const IClosestPointMapper& mapper, const ON_Mesh & meshTo, const ON_3fVector & vtFaceNormal, const ON_3dPoint * vtx, int i0, int i1, int i2, ON_3dPoint * tOut)
{
	const double n = 3.0;
	const double m = (n + 1.0) / (n - 1.0);
	const double k = 1.0 / (n - 1.0);

	ON_3dPoint sample_points[3];

	sample_points[0] = n / (n + 2.0) * vtx[i0] + 1.0 / (n + 2.0) * (vtx[i1] + vtx[i2]);
	sample_points[1] = n / (n + 2.0) * vtx[i1] + 1.0 / (n + 2.0) * (vtx[i0] + vtx[i2]);
	sample_points[2] = n / (n + 2.0) * vtx[i2] + 1.0 / (n + 2.0) * (vtx[i0] + vtx[i1]);

	ON_3dPoint sample_tcs[3] = { ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin };

	for (int i = 0; i < 3; i++)
	{
		mapper.ClosestPointTC(sample_points[i], vtFaceNormal, sample_tcs[i]);
	}

	tOut[0] = m * sample_tcs[0] - k * (sample_tcs[1] + sample_tcs[2]);
	tOut[1] = m * sample_tcs[1] - k * (sample_tcs[0] + sample_tcs[2]);
	tOut[2] = m * sample_tcs[2] - k * (sample_tcs[0] + sample_tcs[1]);
}